

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_57ee5a::TransformReplace::Transform
          (string *__return_storage_ptr__,TransformReplace *this,string *input)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  transform_error *this_00;
  string local_1d0;
  undefined1 local_1b0 [8];
  ostringstream error;
  string *input_local;
  TransformReplace *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = cmStringReplaceHelper::Replace(&this->ReplaceHelper,input,__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  poVar2 = std::operator<<((ostream *)local_1b0,"sub-command TRANSFORM, action REPLACE: ");
  psVar3 = cmStringReplaceHelper::GetError_abi_cxx11_(&this->ReplaceHelper);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  std::operator<<(poVar2,".");
  this_00 = (transform_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  transform_error::transform_error(this_00,&local_1d0);
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              transform_error::~transform_error);
}

Assistant:

std::string Transform(const std::string& input) override
  {
    // Scan through the input for all matches.
    std::string output;

    if (!this->ReplaceHelper.Replace(input, output)) {
      std::ostringstream error;
      error << "sub-command TRANSFORM, action REPLACE: "
            << this->ReplaceHelper.GetError() << ".";
      throw transform_error(error.str());
    }

    return output;
  }